

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_binder.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::InsertBinder::BindExpression
          (BindResult *__return_storage_ptr__,InsertBinder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr_ptr,idx_t depth,bool root_expression)

{
  ExpressionClass EVar1;
  type expr;
  allocator local_59;
  BinderException local_58;
  string local_48;
  
  expr = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
         operator*(expr_ptr);
  EVar1 = (expr->super_BaseExpression).expression_class;
  if (EVar1 == WINDOW) {
    ::std::__cxx11::string::string
              ((string *)&local_48,"INSERT statement cannot contain window functions!",&local_59);
    BinderException::Unsupported(&local_58,expr,&local_48);
    BindResult::BindResult(__return_storage_ptr__,&local_58.super_Exception);
  }
  else {
    if (EVar1 != DEFAULT) {
      ExpressionBinder::BindExpression
                (__return_storage_ptr__,&this->super_ExpressionBinder,expr_ptr,depth,false);
      return __return_storage_ptr__;
    }
    ::std::__cxx11::string::string((string *)&local_48,"DEFAULT is not allowed here!",&local_59);
    BinderException::Unsupported(&local_58,expr,&local_48);
    BindResult::BindResult(__return_storage_ptr__,&local_58.super_Exception);
  }
  ::std::runtime_error::~runtime_error((runtime_error *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

BindResult InsertBinder::BindExpression(unique_ptr<ParsedExpression> &expr_ptr, idx_t depth, bool root_expression) {
	auto &expr = *expr_ptr;
	switch (expr.GetExpressionClass()) {
	case ExpressionClass::DEFAULT:
		return BindResult(BinderException::Unsupported(expr, "DEFAULT is not allowed here!"));
	case ExpressionClass::WINDOW:
		return BindResult(BinderException::Unsupported(expr, "INSERT statement cannot contain window functions!"));
	default:
		return ExpressionBinder::BindExpression(expr_ptr, depth);
	}
}